

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_secrets.cpp
# Opt level: O2

unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>,_true> __thiscall
duckdb::CreateHTTPSecretFunctions::CreateHTTPSecretFromEnv
          (CreateHTTPSecretFunctions *this,ClientContext *context,CreateSecretInput *input)

{
  char *pcVar1;
  pointer pKVar2;
  mapped_type *pmVar3;
  allocator local_81;
  _Head_base<0UL,_duckdb::KeyValueSecret_*,_false> local_80;
  key_type local_78;
  Value local_58;
  
  make_uniq<duckdb::KeyValueSecret,duckdb::vector<std::__cxx11::string,true>&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            ((duckdb *)&local_80,&input->scope,&input->type,&input->provider,&input->name);
  pcVar1 = TryGetEnv("http_proxy");
  if (pcVar1 != (char *)0x0) {
    Value::Value(&local_58,pcVar1);
    pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
             operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                         *)&local_80);
    ::std::__cxx11::string::string((string *)&local_78,"http_proxy",&local_81);
    pmVar3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             ::operator[](&pKVar2->secret_map,&local_78);
    Value::operator=(pmVar3,&local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
    Value::~Value(&local_58);
  }
  pcVar1 = TryGetEnv("http_proxy_password");
  if (pcVar1 != (char *)0x0) {
    Value::Value(&local_58,pcVar1);
    pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
             operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                         *)&local_80);
    ::std::__cxx11::string::string((string *)&local_78,"http_proxy_password",&local_81);
    pmVar3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             ::operator[](&pKVar2->secret_map,&local_78);
    Value::operator=(pmVar3,&local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
    Value::~Value(&local_58);
  }
  pcVar1 = TryGetEnv("http_proxy_username");
  if (pcVar1 != (char *)0x0) {
    Value::Value(&local_58,pcVar1);
    pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
             operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                         *)&local_80);
    ::std::__cxx11::string::string((string *)&local_78,"http_proxy_username",&local_81);
    pmVar3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             ::operator[](&pKVar2->secret_map,&local_78);
    Value::operator=(pmVar3,&local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
    Value::~Value(&local_58);
  }
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_80);
  ::std::__cxx11::string::string((string *)&local_58,"http_proxy",(allocator *)&local_78);
  KeyValueSecret::TrySetValue(pKVar2,(string *)&local_58,input);
  ::std::__cxx11::string::~string((string *)&local_58);
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_80);
  ::std::__cxx11::string::string((string *)&local_58,"http_proxy_password",(allocator *)&local_78);
  KeyValueSecret::TrySetValue(pKVar2,(string *)&local_58,input);
  ::std::__cxx11::string::~string((string *)&local_58);
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_80);
  ::std::__cxx11::string::string((string *)&local_58,"http_proxy_username",(allocator *)&local_78);
  KeyValueSecret::TrySetValue(pKVar2,(string *)&local_58,input);
  ::std::__cxx11::string::~string((string *)&local_58);
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_80);
  ::std::__cxx11::string::string((string *)&local_58,"extra_http_headers",(allocator *)&local_78);
  KeyValueSecret::TrySetValue(pKVar2,(string *)&local_58,input);
  ::std::__cxx11::string::~string((string *)&local_58);
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_80);
  ::std::__cxx11::string::string((string *)&local_58,"bearer_token",(allocator *)&local_78);
  KeyValueSecret::TrySetValue(pKVar2,(string *)&local_58,input);
  ::std::__cxx11::string::~string((string *)&local_58);
  *(KeyValueSecret **)this = local_80._M_head_impl;
  return (unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>_>)
         (unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>_>)this;
}

Assistant:

unique_ptr<BaseSecret> CreateHTTPSecretFunctions::CreateHTTPSecretFromEnv(ClientContext &context,
                                                                          CreateSecretInput &input) {
	auto secret = make_uniq<KeyValueSecret>(input.scope, input.type, input.provider, input.name);

	auto http_proxy = TryGetEnv("http_proxy");
	if (http_proxy) {
		secret->secret_map["http_proxy"] = Value(http_proxy);
	}
	auto http_proxy_password = TryGetEnv("http_proxy_password");
	if (http_proxy_password) {
		secret->secret_map["http_proxy_password"] = Value(http_proxy_password);
	}
	auto http_proxy_username = TryGetEnv("http_proxy_username");
	if (http_proxy_username) {
		secret->secret_map["http_proxy_username"] = Value(http_proxy_username);
	}

	// Allow overwrites
	secret->TrySetValue("http_proxy", input);
	secret->TrySetValue("http_proxy_password", input);
	secret->TrySetValue("http_proxy_username", input);

	secret->TrySetValue("extra_http_headers", input);
	secret->TrySetValue("bearer_token", input);

	return std::move(secret);
}